

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

pair<const_llvm::Value_*,_bool>
dg::vr::getCompared(ValueRelations *graph,ICmpInst *icmp,Value *from)

{
  V pVVar1;
  V val;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  _Var2;
  V pVVar3;
  long lVar4;
  ulong uVar5;
  pair<const_llvm::Value_*,_bool> pVar6;
  _Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_60;
  V local_48 [3];
  
  local_48[2] = from;
  pVVar1 = *(V *)(icmp + -0x40);
  pVVar3 = *(V *)(icmp + -0x20);
  local_48[0] = pVVar1;
  local_48[1] = pVVar3;
  lVar4 = 0;
  do {
    if (lVar4 == 0x10) {
      pVVar3 = (V)0x0;
      uVar5 = 0;
LAB_00134431:
      pVar6._8_8_ = uVar5 & 0xffffffff;
      pVar6.first = pVVar3;
      return pVar6;
    }
    val = *(V *)((long)local_48 + lVar4);
    RelationsAnalyzer::getFroms
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)&local_60,graph,
               val);
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Value_const*const>>
                      (local_60._M_impl.super__Vector_impl_data._M_start,
                       local_60._M_impl.super__Vector_impl_data._M_finish,local_48 + 2);
    if (_Var2._M_current != local_60._M_impl.super__Vector_impl_data._M_finish) {
      if (val != pVVar1) {
        pVVar3 = pVVar1;
      }
      uVar5 = CONCAT71((int7)((ulong)graph >> 8),
                       (ulong)((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_60._M_impl.super__Vector_impl_data._M_start) < 9);
      std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
                (&local_60);
      goto LAB_00134431;
    }
    std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
              (&local_60);
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

std::pair<V, bool> getCompared(const ValueRelations &graph,
                               const llvm::ICmpInst *icmp,
                               const llvm::Value *from) {
    const auto *op1 = icmp->getOperand(0);
    const auto *op2 = icmp->getOperand(1);

    for (const auto *op : {op1, op2}) {
        const auto &froms = RelationsAnalyzer::getFroms(graph, op);
        if (std::find(froms.begin(), froms.end(), from) != froms.end()) {
            if (op == op1)
                return {op2, froms.size() <= 1};
            return {op1, froms.size() <= 1};
        }
    }
    return {nullptr, false};
}